

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O2

QDate __thiscall
QtPrivate::QCalendarMonthValidator::applyToDate
          (QCalendarMonthValidator *this,undefined8 param_2,undefined8 param_3)

{
  long lVar1;
  int extraout_var;
  QDate QVar2;
  int iVar3;
  long in_FS_OFFSET;
  QCalendar cal_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  _cal_local = param_3;
  QCalendar::partsFromDate((QDate)&cal_local);
  if (extraout_var == -0x80000000) {
    QVar2.jd = -0x8000000000000000;
  }
  else {
    iVar3 = (int)(YearMonthDay *)&cal_local;
    QCalendar::monthsInYear(iVar3);
    QCalendar::daysInMonth(iVar3,this->m_month);
    QVar2.jd = QCalendar::dateFromParts((YearMonthDay *)&cal_local);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QDate)QVar2.jd;
  }
  __stack_chk_fail();
}

Assistant:

QDate QCalendarMonthValidator::applyToDate(QDate date, QCalendar cal) const
{
    auto parts = cal.partsFromDate(date);
    if (!parts.isValid())
        return QDate();
    parts.month = qMin(qMax(1, m_month), cal.monthsInYear(parts.year));
    parts.day = qMin(parts.day, cal.daysInMonth(m_month, parts.year)); // m_month or parts.month ?
    return cal.dateFromParts(parts);
}